

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int backtrackBysatCounterExamples(saucy *s,coloring *c)

{
  int iVar1;
  int *__ptr;
  sim_result *cex;
  sim_result *cex_00;
  int *flag;
  sim_result *cex2;
  sim_result *cex1;
  int local_28;
  int res;
  int j;
  int i;
  coloring *c_local;
  saucy *s_local;
  
  iVar1 = Vec_PtrSize(s->satCounterExamples);
  __ptr = zeros(iVar1);
  if ((c != &s->left) && (iVar1 = Vec_PtrSize(s->satCounterExamples), iVar1 != 0)) {
    for (res = 0; iVar1 = Vec_PtrSize(s->satCounterExamples), res < iVar1; res = res + 1) {
      cex = (sim_result *)Vec_PtrEntry(s->satCounterExamples,res);
      for (local_28 = 0; iVar1 = Vec_PtrSize(s->satCounterExamples), local_28 < iVar1;
          local_28 = local_28 + 1) {
        if (__ptr[local_28] == 0) {
          cex_00 = (sim_result *)Vec_PtrEntry(s->satCounterExamples,local_28);
          iVar1 = ifInputVectorsAreConsistent(s,cex->inVec,cex_00->inVec);
          if (iVar1 == -2) {
            __ptr[local_28] = 1;
          }
          else {
            if (iVar1 == -1) break;
            if (iVar1 != 0) {
              if (cex->outVecOnes != cex_00->outVecOnes) {
                bumpActivity(s,cex);
                bumpActivity(s,cex_00);
                if (__ptr != (int *)0x0) {
                  free(__ptr);
                }
                return 0;
              }
              iVar1 = Abc_NtkPoNum(s->pNtk);
              if ((iVar1 != 1) &&
                 (iVar1 = ifOutputVectorsAreConsistent(s,cex->outVec,cex_00->outVec), iVar1 == 0)) {
                bumpActivity(s,cex);
                bumpActivity(s,cex_00);
                if (__ptr != (int *)0x0) {
                  free(__ptr);
                }
                return 0;
              }
            }
          }
        }
      }
    }
    if (__ptr != (int *)0x0) {
      free(__ptr);
    }
  }
  return 1;
}

Assistant:

static int
backtrackBysatCounterExamples(struct saucy *s, struct coloring *c)
{
    int i, j, res;  
    struct sim_result * cex1, * cex2;
    int * flag = zeros(Vec_PtrSize(s->satCounterExamples));

    if (c == &s->left) return 1;
    if (Vec_PtrSize(s->satCounterExamples) == 0) return 1;      

    for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {  
        cex1 = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);      

        for (j = 0; j < Vec_PtrSize(s->satCounterExamples); j++) {
            if (flag[j]) continue;
        
            cex2 = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, j);
            res = ifInputVectorsAreConsistent(s, cex1->inVec, cex2->inVec);

            if (res == -2) {
                flag[j] = 1;
                continue;
            }
            if (res == -1) break;
            if (res == 0) continue;

            if (cex1->outVecOnes != cex2->outVecOnes) {
                bumpActivity(s, cex1);
                bumpActivity(s, cex2);
                ABC_FREE(flag);
                return 0;
            }

            /* if two input vectors produce the same number of ones (look above), and
             * pNtk's number of outputs is 1, then output vectors are definitely consistent. */
            if (Abc_NtkPoNum(s->pNtk) == 1) continue;

            if (!ifOutputVectorsAreConsistent(s, cex1->outVec, cex2->outVec)) {
                bumpActivity(s, cex1);
                bumpActivity(s, cex2);
                ABC_FREE(flag);
                return 0;
            }
        }
    }

    ABC_FREE(flag);
    return 1;
}